

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_range.cc
# Opt level: O0

void re2c::UTF8addContinuous(RangeSuffix **root,rune l,rune h,uint32_t n)

{
  uint32_t lo;
  uint32_t hi;
  RangeSuffix *pRVar1;
  uint32_t hc;
  uint32_t lc;
  uint32_t i;
  RangeSuffix **p;
  uint32_t hcs [4];
  uint32_t lcs [4];
  uint32_t n_local;
  rune h_local;
  rune l_local;
  RangeSuffix **root_local;
  
  utf8::rune_to_bytes(hcs + 2,l);
  utf8::rune_to_bytes((uint32_t *)&p,h);
  hc = 1;
  _lc = root;
  do {
    if (n < hc) {
      return;
    }
    lo = hcs[(ulong)(n - hc) + 2];
    hi = hcs[(ulong)(n - hc) - 2];
    for (; *_lc != (RangeSuffix *)0x0; _lc = &(*_lc)->next) {
      if (((*_lc)->l == lo) && ((*_lc)->h == hi)) {
        pRVar1 = *_lc;
        goto LAB_001ac47d;
      }
    }
    pRVar1 = (RangeSuffix *)operator_new(0x18);
    RangeSuffix::RangeSuffix(pRVar1,lo,hi);
    *_lc = pRVar1;
    pRVar1 = *_lc;
LAB_001ac47d:
    _lc = &pRVar1->child;
    hc = hc + 1;
  } while( true );
}

Assistant:

void UTF8addContinuous(RangeSuffix * & root, utf8::rune l, utf8::rune h, uint32_t n)
{
	uint32_t lcs[utf8::MAX_RUNE_LENGTH];
	uint32_t hcs[utf8::MAX_RUNE_LENGTH];
	utf8::rune_to_bytes(lcs, l);
	utf8::rune_to_bytes(hcs, h);

	RangeSuffix ** p = &root;
	for (uint32_t i = 1; i <= n; ++i)
	{
		const uint32_t lc = lcs[n - i];
		const uint32_t hc = hcs[n - i];
		for (;;)
		{
			if (*p == NULL)
			{
				*p = new RangeSuffix(lc, hc);
				p = &(*p)->child;
				break;
			}
			else if ((*p)->l == lc && (*p)->h == hc)
			{
				p = &(*p)->child;
				break;
			}
			else
				p = &(*p)->next;
		}
	}
}